

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_sparse.c
# Opt level: O3

void __thiscall
lu_solve_sparse(void *this,lu_int nrhs,lu_int *irhs,double *xrhs,lu_int *p_nlhs,lu_int *ilhs,
               double *xlhs,char trans)

{
  int iVar1;
  lu_int *plVar2;
  double *value;
  lu_int *marked;
  double *lhs;
  bool bVar3;
  lu_int *plVar4;
  lu_int *begin;
  lu_int lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  lu_int *plVar15;
  double dVar16;
  lu_int Uflops;
  lu_int Lflops;
  uint *local_110;
  double local_108;
  long local_100;
  void *local_f8;
  lu_int *local_f0;
  lu_int *local_e8;
  int *local_e0;
  int local_d4;
  lu_int *local_d0;
  lu_int *local_c8;
  lu_int *local_c0;
  lu_int *local_b8;
  lu_int *local_b0;
  long local_a8;
  lu_int *local_a0;
  lu_int *local_98;
  ulong local_90;
  double *local_88;
  lu_int *local_80;
  double *local_78;
  lu_int *local_70;
  double *local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  double *local_40;
  double *local_38;
  
  iVar6 = *(int *)((long)this + 0x54);
  local_100 = (long)iVar6;
  local_90 = (ulong)*(uint *)((long)this + 0x68);
  local_48 = (ulong)*(uint *)((long)this + 400);
  local_108 = *(double *)((long)this + 0x10);
  local_58 = *(long *)((long)this + 0x250);
  lVar10 = *(long *)((long)this + 0x260);
  local_50 = *(long *)((long)this + 0x270);
  local_60 = *(long *)((long)this + 0x200);
  local_a0 = *(lu_int **)((long)this + 0x1d8);
  local_98 = *(lu_int **)((long)this + 0x1e8);
  local_c0 = *(lu_int **)((long)this + 0x220);
  local_a8 = *(long *)((long)this + 0x240);
  local_80 = *(lu_int **)((long)this + 0x280);
  local_e0 = *(int **)((long)this + 0x1f8);
  local_38 = *(double **)((long)this + 0x2a8);
  local_78 = *(double **)((long)this + 0x2b0);
  plVar2 = *(lu_int **)((long)this + 0x1a0);
  value = *(double **)((long)this + 0x1b8);
  local_b8 = *(lu_int **)((long)this + 0x1a8);
  local_88 = *(double **)((long)this + 0x1c0);
  local_40 = *(double **)((long)this + 0x1c8);
  marked = *(lu_int **)((long)this + 0x290);
  Lflops = 0;
  Uflops = 0;
  local_d4 = (int)((double)iVar6 * *(double *)((long)this + 0x48));
  uVar8 = *(int *)((long)this + 0x18c) + 1;
  local_d0 = (lu_int *)(ulong)uVar8;
  local_f0 = *(lu_int **)((long)this + 0x210);
  lhs = *(double **)((long)this + 0x298);
  local_70 = *(lu_int **)((long)this + 0x2a0);
  *(uint *)((long)this + 0x18c) = uVar8;
  local_e8 = local_f0 + local_100;
  local_110 = (uint *)p_nlhs;
  local_f8 = this;
  local_c8 = ilhs;
  local_b0 = irhs;
  local_68 = xrhs;
  if ((trans & 0xdfU) == 0x54) {
    local_d0 = *(lu_int **)((long)this + 0x230);
    local_c0 = *(lu_int **)((long)this + 0x1b0);
    local_a0 = *(lu_int **)((long)this + 0x228);
    local_98 = *(lu_int **)((long)this + 0x218);
    lVar5 = lu_solve_symbolic(iVar6,*(lu_int **)((long)this + 0x218),
                              *(lu_int **)((long)this + 0x228),*(lu_int **)((long)this + 0x1b0),nrhs
                              ,irhs,local_f0,local_70,marked,uVar8);
    plVar15 = local_e8;
    if (0 < nrhs) {
      uVar7 = 0;
      do {
        lhs[local_b0[uVar7]] = local_68[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uint)nrhs != uVar7);
    }
    uVar8 = lu_solve_triangular((int)local_100 - lVar5,local_f0 + lVar5,local_98,local_a0,local_c0,
                                local_40,local_38,local_108,lhs,local_e8,&Uflops);
    plVar4 = local_f0;
    iVar6 = *(int *)((long)local_f8 + 0x18c) + 1;
    *(int *)((long)local_f8 + 0x18c) = iVar6;
    if (0 < (int)uVar8) {
      uVar7 = 0;
      do {
        lVar11 = (long)plVar15[uVar7];
        iVar13 = *(int *)(lVar10 + lVar11 * 4);
        plVar15[uVar7] = iVar13;
        xlhs[iVar13] = lhs[lVar11];
        lhs[lVar11] = 0.0;
        marked[iVar13] = iVar6;
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
    iVar9 = 0;
    uVar7 = local_90;
    if (0 < (int)local_90) {
      do {
        dVar16 = xlhs[*(int *)(local_60 + -4 + uVar7 * 4)];
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          lVar10 = (long)local_e0[uVar7 - 1];
          iVar13 = local_e0[uVar7];
          if (local_e0[uVar7 - 1] < iVar13) {
            do {
              iVar14 = plVar2[lVar10];
              if (marked[iVar14] != iVar6) {
                marked[iVar14] = iVar6;
                lVar11 = (long)(int)uVar8;
                uVar8 = uVar8 + 1;
                plVar15[lVar11] = iVar14;
                iVar13 = local_e0[uVar7];
              }
              xlhs[iVar14] = value[lVar10] * -dVar16 + xlhs[iVar14];
              iVar9 = iVar9 + 1;
              lVar10 = lVar10 + 1;
            } while (lVar10 < iVar13);
          }
        }
        bVar3 = 1 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar3);
    }
    iVar6 = (int)local_100;
    if (local_d4 < (int)uVar8) {
      if (iVar6 < 1) {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        lVar5 = Lflops;
        do {
          iVar6 = *(int *)(local_58 + -4 + local_100 * 4);
          dVar16 = xlhs[iVar6];
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            lVar10 = (long)*(int *)(local_a8 + (local_100 + -1) * 4);
            uVar12 = plVar2[lVar10];
            if (-1 < (int)uVar12) {
              do {
                xlhs[uVar12] = value[lVar10] * -dVar16 + xlhs[uVar12];
                lVar5 = lVar5 + 1;
                uVar12 = plVar2[lVar10 + 1];
                lVar10 = lVar10 + 1;
                Lflops = lVar5;
              } while (-1 < (int)uVar12);
            }
            if (ABS(dVar16) <= local_108) {
              xlhs[iVar6] = 0.0;
            }
            else {
              lVar10 = (long)(int)uVar8;
              uVar8 = uVar8 + 1;
              local_c8[lVar10] = iVar6;
            }
          }
          bVar3 = 1 < local_100;
          local_100 = local_100 + -1;
        } while (bVar3);
      }
    }
    else {
      iVar13 = *(int *)((long)local_f8 + 0x18c) + 1;
      *(int *)((long)local_f8 + 0x18c) = iVar13;
      lVar5 = lu_solve_symbolic(iVar6,local_d0,(lu_int *)0x0,plVar2,uVar8,plVar15,local_f0,local_70,
                                marked,iVar13);
      uVar8 = lu_solve_triangular(iVar6 - lVar5,plVar4 + lVar5,local_d0,(lu_int *)0x0,plVar2,value,
                                  (double *)0x0,local_108,xlhs,local_c8,&Lflops);
    }
  }
  else {
    lVar5 = lu_solve_symbolic(iVar6,local_c0,(lu_int *)0x0,plVar2,nrhs,irhs,local_f0,local_70,marked
                              ,uVar8);
    iVar6 = (int)local_100 - lVar5;
    if (0 < nrhs) {
      uVar7 = 0;
      do {
        lhs[irhs[uVar7]] = local_68[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uint)nrhs != uVar7);
    }
    plVar15 = local_f0 + lVar5;
    local_a8 = CONCAT44(local_a8._4_4_,iVar6);
    iVar6 = lu_solve_triangular(iVar6,plVar15,local_c0,(lu_int *)0x0,plVar2,value,(double *)0x0,
                                local_108,lhs,local_e8,&Lflops);
    begin = local_80;
    plVar4 = local_f0;
    iVar13 = (int)local_100;
    if (iVar6 < (int)local_a8) {
      if (0 < iVar6) {
        iVar9 = 0;
        do {
          if (*plVar15 == local_e8[iVar9]) {
            iVar9 = iVar9 + 1;
          }
          else {
            marked[*plVar15] = marked[*plVar15] + -1;
          }
          plVar15 = plVar15 + 1;
          lVar5 = lVar5 + 1;
        } while (iVar9 < iVar6);
      }
      if (lVar5 < iVar13) {
        lVar10 = (long)lVar5;
        do {
          marked[local_f0[lVar10]] = marked[local_f0[lVar10]] + -1;
          lVar10 = lVar10 + 1;
        } while (local_100 != lVar10);
      }
    }
    iVar9 = *local_e0;
    if (0 < (int)local_90) {
      uVar7 = 0;
      do {
        iVar14 = local_e0[uVar7 + 1];
        if (iVar9 < iVar14) {
          iVar1 = *(int *)(local_60 + uVar7 * 4);
          lVar10 = (long)iVar9;
          dVar16 = 0.0;
          do {
            dVar16 = dVar16 + lhs[plVar2[lVar10]] * value[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar14 != lVar10);
          lhs[iVar1] = lhs[iVar1] - dVar16;
          iVar9 = iVar14;
          if (((dVar16 != 0.0) || (NAN(dVar16))) && (marked[iVar1] != (int)local_d0)) {
            marked[iVar1] = (int)local_d0;
            lVar10 = (long)iVar6;
            iVar6 = iVar6 + 1;
            local_e8[lVar10] = iVar1;
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_90);
      iVar9 = *local_e0;
    }
    iVar9 = local_e0[(int)local_90] - iVar9;
    if (local_d4 < iVar6) {
      if ((int)local_48 < 1) {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        lVar5 = Uflops;
        do {
          iVar6 = *(int *)((long)local_98 + -4 + local_48 * 4);
          dVar16 = lhs[iVar6];
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            iVar13 = *(int *)((long)local_a0 + -4 + local_48 * 4);
            dVar16 = dVar16 / local_78[iVar6];
            lhs[iVar6] = 0.0;
            lVar10 = (long)local_80[iVar6];
            uVar12 = local_b8[lVar10];
            if (-1 < (int)uVar12) {
              do {
                lhs[uVar12] = local_88[lVar10] * -dVar16 + lhs[uVar12];
                lVar5 = lVar5 + 1;
                uVar12 = local_b8[lVar10 + 1];
                lVar10 = lVar10 + 1;
                Uflops = lVar5;
              } while (-1 < (int)uVar12);
            }
            if (local_108 < ABS(dVar16)) {
              lVar10 = (long)(int)uVar8;
              uVar8 = uVar8 + 1;
              local_c8[lVar10] = iVar13;
              xlhs[iVar13] = dVar16;
            }
          }
          bVar3 = 1 < (long)local_48;
          local_48 = local_48 - 1;
        } while (bVar3);
      }
    }
    else {
      iVar14 = *(int *)((long)local_f8 + 0x18c) + 1;
      *(int *)((long)local_f8 + 0x18c) = iVar14;
      lVar5 = lu_solve_symbolic(iVar13,local_80,(lu_int *)0x0,local_b8,iVar6,local_e8,local_f0,
                                local_70,marked,iVar14);
      plVar2 = local_c8;
      uVar8 = lu_solve_triangular(iVar13 - lVar5,plVar4 + lVar5,begin,(lu_int *)0x0,local_b8,
                                  local_88,local_78,local_108,lhs,local_c8,&Uflops);
      if (0 < (int)uVar8) {
        uVar7 = 0;
        do {
          lVar10 = (long)plVar2[uVar7];
          iVar6 = *(int *)(local_50 + lVar10 * 4);
          plVar2[uVar7] = iVar6;
          xlhs[iVar6] = lhs[lVar10];
          lhs[lVar10] = 0.0;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
  }
  *local_110 = uVar8;
  *(int *)((long)local_f8 + 0xe0) = *(int *)((long)local_f8 + 0xe0) + Lflops;
  *(int *)((long)local_f8 + 0xe4) = *(int *)((long)local_f8 + 0xe4) + Uflops;
  *(int *)((long)local_f8 + 0xe8) = *(int *)((long)local_f8 + 0xe8) + iVar9;
  *(double *)((long)local_f8 + 0xa0) = (double)iVar9 + *(double *)((long)local_f8 + 0xa0);
  return;
}

Assistant:

void lu_solve_sparse(
    struct lu *this, const lu_int nrhs, const lu_int *irhs, const double *xrhs,
    lu_int *p_nlhs, lu_int *ilhs, double *xlhs, char trans)
{
    const lu_int m                  = this->m;
    const lu_int nforrest           = this->nforrest;
    const lu_int pivotlen           = this->pivotlen;
    const lu_int nz_sparse          = this->sparse_thres * m;
    const double droptol            = this->droptol;
    const lu_int *p                 = this->p;
    const lu_int *pmap              = this->pmap;
    const lu_int *qmap              = this->qmap;
    const lu_int *eta_row           = this->eta_row;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin            = this->Lbegin;
    const lu_int *Ltbegin           = this->Ltbegin;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const lu_int *Rbegin            = this->Rbegin;
    const lu_int *Wbegin            = this->Wbegin;
    const lu_int *Wend              = this->Wend;
    const double *col_pivot         = this->col_pivot;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    const lu_int *Windex            = this->Windex;
    const double *Wvalue            = this->Wvalue;
    lu_int *marked                  = this->marked;

    lu_int i, j, k, n, t, top, pos, ipivot, jpivot, nz, nz_symb, M;
    double x;

    lu_int Lflops = 0, Uflops = 0, Rflops = 0;

    if (trans == 't' || trans == 'T')
    {
        /* ----------------------- */
        /* Solve transposed system */
        /* ----------------------- */

        lu_int *pattern_symb = this->iwork1;
        lu_int *pattern      = this->iwork1 + m;
        double *work         = this->work0;
        lu_int *pstack       = (void *) this->work1;
        assert(sizeof(lu_int) <= sizeof(double));

        /*
         * Sparse triangular solve with U'.
         * Solution scattered into work, indices in pattern[0..nz-1].
         */
        M = ++this->marker;
        top = lu_solve_symbolic(m, Wbegin, Wend, Windex, nrhs, irhs,
                                pattern_symb, pstack, marked, M);
        nz_symb = m-top;

        for (n = 0; n < nrhs; n++)
            work[irhs[n]] = xrhs[n];
        nz = lu_solve_triangular(nz_symb, pattern_symb+top, Wbegin, Wend,
                                 Windex, Wvalue, col_pivot, droptol, work,
                                 pattern, &Uflops);

        /*
         * Permute solution into xlhs.
         * Map pattern from column indices to row indices.
         */
        M = ++this->marker;
        for (n = 0; n < nz; n++)
        {
            j = pattern[n];
            i = pmap[j];
            pattern[n] = i;
            xlhs[i] = work[j];
            work[j] = 0;
            marked[i] = M;
        }

        /*
         * Solve with update etas.
         * Append fill-in to pattern.
         */
        for (t = nforrest-1; t >= 0; t--)
        {
            ipivot = eta_row[t];
            if (xlhs[ipivot])
            {
                x = xlhs[ipivot];
                for (pos = Rbegin[t]; pos < Rbegin[t+1]; pos++)
                {
                    i = Lindex[pos];
                    if (marked[i] != M)
                    {
                        marked[i] = M;
                        pattern[nz++] = i;
                    }
                    xlhs[i] -= x * Lvalue[pos];
                    Rflops++;
                }
            }
        }

        if (nz <= nz_sparse)
        {
            /*
             * Sparse triangular solve with L'.
             * Solution scattered into xlhs, indices in ilhs[0..nz-1].
             */
            M = ++this->marker;
            top = lu_solve_symbolic(m, Ltbegin, NULL, Lindex, nz, pattern,
                                    pattern_symb, pstack, marked, M);
            nz_symb = m-top;

            nz = lu_solve_triangular(nz_symb, pattern_symb+top, Ltbegin, NULL,
                                      Lindex, Lvalue, NULL, droptol, xlhs, ilhs,
                                      &Lflops);
            *p_nlhs = nz;
        }
        else
        {
            /*
             * Sequential triangular solve with L'.
             * Solution scattered into xlhs, indices in ilhs[0..nz-1].
             */
            nz = 0;
            for (k = m-1; k >= 0; k--)
            {
                ipivot = p[k];
                if (xlhs[ipivot])
                {
                    x = xlhs[ipivot];
                    for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
                    {
                        xlhs[i] -= x * Lvalue[pos];
                        Lflops++;
                    }
                    if (fabs(x) > droptol)
                        ilhs[nz++] = ipivot;
                    else
                        xlhs[ipivot] = 0.0;
                }
            }
            *p_nlhs = nz;
        }
    }
    else
    {
        /* -------------------- */
        /* Solve forward system */
        /* -------------------- */

        lu_int *pattern_symb = this->iwork1;
        lu_int *pattern      = this->iwork1 + m;
        double *work         = this->work0;
        lu_int *pstack       = (void *) this->work1;
        assert(sizeof(lu_int) <= sizeof(double));

        /*
         * Sparse triangular solve with L.
         * Solution scattered into work, indices in pattern[0..nz-1].
         */
        M = ++this->marker;
        top = lu_solve_symbolic(m, Lbegin, NULL, Lindex, nrhs, irhs,
                                pattern_symb, pstack, marked, M);
        nz_symb = m-top;

        for (n = 0; n < nrhs; n++)
            work[irhs[n]] = xrhs[n];
        nz = lu_solve_triangular(nz_symb, pattern_symb+top, Lbegin, NULL,
                                 Lindex, Lvalue, NULL, droptol, work, pattern,
                                 &Lflops);

        /* unmark cancellation */
        if (nz < nz_symb)
        {
            for (t = top, n = 0; n < nz; t++)
            {
                i = pattern_symb[t];
                if (i == pattern[n])
                    n++;
                else
                    marked[i]--;
            }
            for ( ; t < m; t++)
                marked[pattern_symb[t]]--;
        }

        /*
         * Solve with update etas.
         * Append fill-in to pattern.
         */
        pos = Rbegin[0];
        for (t = 0; t < nforrest; t++)
        {
            ipivot = eta_row[t];
            x = 0.0;
            for ( ; pos < Rbegin[t+1]; pos++)
            {
                x += work[Lindex[pos]] * Lvalue[pos];
            }
            work[ipivot] -= x;
            if (x && marked[ipivot] != M)
            {
                marked[ipivot] = M;
                pattern[nz++] = ipivot;
            }
        }
        Rflops += Rbegin[nforrest] - Rbegin[0];

        if (nz <= nz_sparse)
        {
            /*
             * Sparse triangular solve with U.
             * Solution scattered into work, indices in ilhs[0..nz-1].
             */
            M = ++this->marker;
            top = lu_solve_symbolic(m, Ubegin, NULL, Uindex, nz, pattern,
                                    pattern_symb, pstack, marked, M);
            nz_symb = m-top;

            nz = lu_solve_triangular(nz_symb, pattern_symb+top, Ubegin, NULL,
                                     Uindex, Uvalue, row_pivot, droptol, work,
                                     ilhs, &Uflops);

            /*
             * Permute solution into xlhs.
             * Map pattern from row indices to column indices.
             */
            for (n = 0; n < nz; n++)
            {
                i = ilhs[n];
                j = qmap[i];
                ilhs[n] = j;
                xlhs[j] = work[i];
                work[i] = 0;
            }
        }
        else
        {
            /*
             * Sequential triangular solve with U.
             * Solution computed in work and permuted into xlhs.
             * Pattern (in column indices) stored in ilhs[0..nz-1].
             */
            nz = 0;
            for (k = pivotlen-1; k >= 0; k--)
            {
                ipivot = pivotrow[k];
                jpivot = pivotcol[k];
                if (work[ipivot])
                {
                    x = work[ipivot] / row_pivot[ipivot];
                    work[ipivot] = 0.0;
                    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
                    {
                        work[i] -= x * Uvalue[pos];
                        Uflops++;
                    }
                    if (fabs(x) > droptol)
                    {
                        ilhs[nz++] = jpivot;
                        xlhs[jpivot] = x;
                    }
                }
            }
        }
        *p_nlhs = nz;
    }

    this->Lflops += Lflops;
    this->Uflops += Uflops;
    this->Rflops += Rflops;
    this->update_cost_numer += Rflops;
}